

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_uext(BtorSimBitVector *bv,uint32_t len)

{
  BtorSimBitVector *pBVar1;
  uint32_t in_ESI;
  long in_RDI;
  BtorSimBitVector *res;
  
  pBVar1 = btorsim_bv_new(in_ESI);
  memcpy((void *)((long)pBVar1 + (ulong)*(uint *)(in_RDI + 4) * -4 + (ulong)pBVar1->len * 4 + 8),
         (void *)(in_RDI + 8),(ulong)*(uint *)(in_RDI + 4) << 2);
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_uext (const BtorSimBitVector *bv, uint32_t len)
{
  assert (bv);
  assert (len > 0);

  BtorSimBitVector *res;

  res = btorsim_bv_new (bv->width + len);
  memcpy (
      res->bits + res->len - bv->len, bv->bits, sizeof (*(bv->bits)) * bv->len);

  assert (rem_bits_zero_dbg (res));
  return res;
}